

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

RPCHelpMan * getindexinfo(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff578;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff580;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5b0;
  allocator<char> *in_stack_fffffffffffff5b8;
  iterator in_stack_fffffffffffff5c0;
  RPCArgOptions *in_stack_fffffffffffff5c8;
  string *in_stack_fffffffffffff5d0;
  undefined7 in_stack_fffffffffffff5d8;
  undefined1 in_stack_fffffffffffff5df;
  undefined4 in_stack_fffffffffffff5e0;
  Type in_stack_fffffffffffff5e4;
  string *in_stack_fffffffffffff5e8;
  RPCArg *in_stack_fffffffffffff5f0;
  undefined4 in_stack_fffffffffffff5f8;
  Type in_stack_fffffffffffff5fc;
  RPCResult *in_stack_fffffffffffff600;
  undefined1 *local_9f0;
  undefined1 *local_9d8;
  undefined1 *local_9c0;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  allocator<char> local_832;
  allocator<char> local_831;
  allocator<char> local_830;
  allocator<char> local_82f;
  allocator<char> local_82e;
  allocator<char> local_82d;
  allocator<char> local_82c;
  allocator<char> local_82b [3];
  pointer local_828;
  pointer fun;
  allocator<char> local_80a;
  allocator<char> local_809;
  RPCExamples local_808;
  undefined1 local_7e2;
  vector<RPCArg,_std::allocator<RPCArg>_> local_7e1;
  undefined1 local_7c2;
  undefined1 local_7c1 [31];
  undefined1 local_7a2 [33];
  allocator<char> local_781;
  undefined1 local_780 [38];
  allocator<char> local_75a;
  allocator<char> local_759 [641];
  undefined1 local_4d8 [272];
  undefined1 local_3c8 [64];
  undefined1 local_388 [136];
  undefined1 local_300 [200];
  undefined1 local_238;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined1 local_1f8;
  undefined1 local_1f7;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  local_780._0_4_ = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff588,(Optional *)in_stack_fffffffffffff580);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  local_238 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff590);
  local_210 = 0;
  uStack_208 = 0;
  local_200 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff578);
  local_1f8 = 0;
  local_1f7 = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e4,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff5df,in_stack_fffffffffffff5d8),
                 in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_fffffffffffff578);
  __l._M_len = (size_type)in_stack_fffffffffffff5c8;
  __l._M_array = in_stack_fffffffffffff5c0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff5b8,__l,
             (allocator_type *)in_stack_fffffffffffff5b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  this_00 = (RPCHelpMan *)local_7a2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  name = (string *)local_7c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  description = (string *)&local_7c2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  args = &local_7e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  results = (RPCResults *)&local_7e2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  local_808.m_examples._M_dataplus._M_p = (pointer)0x0;
  local_808.m_examples._M_string_length = 0;
  local_808.m_examples.field_2._M_allocated_capacity = 0;
  examples = &local_808;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff578);
  RPCResult::RPCResult
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5fc,&in_stack_fffffffffffff5f0->m_names
             ,in_stack_fffffffffffff5e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
             (bool)in_stack_fffffffffffff5df);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  local_828 = (pointer)0x0;
  fun = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff578);
  RPCResult::RPCResult
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5fc,&in_stack_fffffffffffff5f0->m_names
             ,in_stack_fffffffffffff5e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
             (bool)in_stack_fffffffffffff5df);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff578);
  __l_00._M_len = (size_type)in_stack_fffffffffffff5c8;
  __l_00._M_array = (iterator)in_stack_fffffffffffff5c0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5b8,__l_00,
             (allocator_type *)in_stack_fffffffffffff5b0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5fc,&in_stack_fffffffffffff5f0->m_names
             ,in_stack_fffffffffffff5e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
             (bool)in_stack_fffffffffffff5df);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff578);
  __l_01._M_len = (size_type)in_stack_fffffffffffff5c8;
  __l_01._M_array = (iterator)in_stack_fffffffffffff5c0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5b8,__l_01,
             (allocator_type *)in_stack_fffffffffffff5b0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5fc,&in_stack_fffffffffffff5f0->m_names
             ,in_stack_fffffffffffff5e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
             (bool)in_stack_fffffffffffff5df);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
             (RPCResult *)in_stack_fffffffffffff5f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  HelpExampleCli(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  HelpExampleRpc(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  std::operator+(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  HelpExampleCli(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  std::operator+(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5c8,(char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  HelpExampleRpc(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  std::operator+(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff578,(string *)0x137d377);
  this = (RPCArg *)&stack0xfffffffffffff7a8;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getindexinfo()::__0,void>(in_stack_fffffffffffff588,in_stack_fffffffffffff580);
  RPCHelpMan::RPCHelpMan(this_00,name,description,args,results,examples,(RPCMethodImpl *)fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_832);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_831);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_830);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_82f);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_82e);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_82d);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_82c);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_82b);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff588);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_9c0 = local_300;
  do {
    local_9c0 = local_9c0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_9c0 != local_388);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff588);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_9d8 = local_3c8;
  do {
    local_9d8 = local_9d8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_9d8 != local_4d8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff588);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_80a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_809);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff588);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_7c1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_7a2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_7a2 + 1));
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff588);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_9f0 = local_48;
  do {
    local_9f0 = local_9f0 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_9f0 != local_150);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_781);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_780 + 7));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_75a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_759);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getindexinfo()
{
    return RPCHelpMan{"getindexinfo",
                "\nReturns the status of one or all available indices currently running in the node.\n",
                {
                    {"index_name", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "Filter results for an index with a specific name."},
                },
                RPCResult{
                    RPCResult::Type::OBJ_DYN, "", "", {
                        {
                            RPCResult::Type::OBJ, "name", "The name of the index",
                            {
                                {RPCResult::Type::BOOL, "synced", "Whether the index is synced or not"},
                                {RPCResult::Type::NUM, "best_block_height", "The block height to which the index is synced"},
                            }
                        },
                    },
                },
                RPCExamples{
                    HelpExampleCli("getindexinfo", "")
                  + HelpExampleRpc("getindexinfo", "")
                  + HelpExampleCli("getindexinfo", "txindex")
                  + HelpExampleRpc("getindexinfo", "txindex")
                },
                [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    UniValue result(UniValue::VOBJ);
    const std::string index_name = request.params[0].isNull() ? "" : request.params[0].get_str();

    if (g_txindex) {
        result.pushKVs(SummaryToJSON(g_txindex->GetSummary(), index_name));
    }

    if (g_coin_stats_index) {
        result.pushKVs(SummaryToJSON(g_coin_stats_index->GetSummary(), index_name));
    }

    ForEachBlockFilterIndex([&result, &index_name](const BlockFilterIndex& index) {
        result.pushKVs(SummaryToJSON(index.GetSummary(), index_name));
    });

    return result;
},
    };
}